

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor.hpp
# Opt level: O2

void __thiscall
jsoncons::csv::basic_csv_cursor<char,jsoncons::stream_source<char>,std::allocator<char>>::
basic_csv_cursor<std::__cxx11::istringstream&>
          (basic_csv_cursor<char,jsoncons::stream_source<char>,std::allocator<char>> *this,
          allocator<char> *param_2,
          basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *param_3,
          basic_csv_decode_options<char> *param_4,
          function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *param_5,
          undefined8 param_6)

{
  char cVar1;
  function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> local_50;
  
  *(undefined8 *)this = 0x99cf58;
  *(undefined8 *)(this + 0x408) = 0x99cff8;
  text_source_adaptor<jsoncons::stream_source<char>>::
  text_source_adaptor<std::__cxx11::istringstream&>
            ((text_source_adaptor<jsoncons::stream_source<char>> *)(this + 8),param_3);
  std::function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)>::function
            (&local_50,param_5);
  basic_csv_parser<char,_std::allocator<char>_>::basic_csv_parser
            ((basic_csv_parser<char,_std::allocator<char>_> *)(this + 0x1a8),param_4,&local_50,
             param_2);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  *(undefined ***)(this + 0x3a8) = &PTR__basic_json_visitor_00998270;
  *(undefined2 *)(this + 0x3b0) = 3;
  *(undefined4 *)(this + 0x3d8) = 0;
  *(undefined8 *)(this + 0x3b8) = 0;
  *(undefined8 *)(this + 0x3c0) = 0;
  *(undefined8 *)(this + 0x3c4) = 0;
  *(undefined8 *)(this + 0x3cc) = 0;
  *(undefined8 *)(this + 0x3e0) = 0;
  *(undefined8 *)(this + 1000) = 0;
  *(undefined8 *)(this + 0x400) = 0;
  *(undefined8 *)(this + 0x3f0) = 0;
  *(undefined8 *)(this + 0x3f8) = 0;
  this[0x281] = (basic_csv_cursor<char,jsoncons::stream_source<char>,std::allocator<char>>)0x1;
  this[0x280] = (basic_csv_cursor<char,jsoncons::stream_source<char>,std::allocator<char>>)
                (this[0x1fc] !=
                (basic_csv_cursor<char,jsoncons::stream_source<char>,std::allocator<char>>)0x3);
  cVar1 = (**(code **)(*(long *)this + 0x18))(this);
  if (cVar1 == '\0') {
    (**(code **)(*(long *)this + 0x40))(this,param_6);
  }
  return;
}

Assistant:

basic_csv_cursor(std::allocator_arg_t, const Allocator& alloc, 
        Sourceable&& source, 
        const basic_csv_decode_options<CharT>& options,
        std::function<bool(csv_errc,const ser_context&)> err_handler,
        std::error_code& ec,
        typename std::enable_if<!std::is_constructible<jsoncons::basic_string_view<CharT>,Sourceable>::value>::type* = 0)
       : source_(std::forward<Sourceable>(source)),
         parser_(options,err_handler,alloc)
    {
        parser_.cursor_mode(true);
        if (!done())
        {
            next(ec);
        }
    }